

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall ClCommandLine_BooleanOption_Test::TestBody(ClCommandLine_BooleanOption_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_528;
  Message local_520;
  uint local_518;
  uint local_514;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_4;
  Message local_4f8;
  bool local_4ea;
  bool local_4e9;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_3;
  Message local_4d0;
  uint local_4c4;
  string local_4c0 [32];
  unsigned_long local_4a0;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_2;
  Message local_480;
  uint local_474;
  string local_470 [32];
  unsigned_long local_450;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_418;
  Message local_410;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_;
  ostringstream local_3f0 [7];
  bool res;
  string_stream errors;
  ostringstream local_278 [8];
  string_stream output;
  allocator local_f9;
  string local_f8;
  AssertHelper local_d8;
  Message local_d0 [3];
  bool local_b2;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  opt<bool,_pstore::command_line::parser<bool,_void>_> option;
  ClCommandLine_BooleanOption_Test *this_local;
  
  pstore::command_line::opt<bool,_pstore::command_line::parser<bool,_void>_>::opt<char[4]>
            ((opt<bool,_pstore::command_line::parser<bool,_void>_> *)&gtest_ar.message_,
             (char (*) [4])0x1e21b0);
  local_b1 = pstore::command_line::opt<bool,_pstore::command_line::parser<bool,_void>_>::get
                       ((opt<bool,_pstore::command_line::parser<bool,_void>_> *)&gtest_ar.message_);
  local_b2 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_b0,"option.get ()","false",&local_b1,&local_b2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"progname",&local_f9);
  (anonymous_namespace)::ClCommandLine::add<char_const*>((ClCommandLine *)this,&local_f8,"--arg");
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::ostringstream::ostringstream(local_278);
  std::__cxx11::ostringstream::ostringstream(local_3f0);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ =
       anon_unknown.dwarf_19dfa::ClCommandLine::parse_command_line_options
                 (&this->super_ClCommandLine,(string_stream *)local_278,(string_stream *)local_3f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_408,
             (bool *)((long)&gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(&local_410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_408,(AssertionResult *)0x1e9800,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_418,&local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  std::__cxx11::ostringstream::str();
  local_450 = std::__cxx11::string::length();
  local_474 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_448,"errors.str ().length ()","0U",&local_450,&local_474);
  std::__cxx11::string::~string(local_470);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  std::__cxx11::ostringstream::str();
  local_4a0 = std::__cxx11::string::length();
  local_4c4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_498,"output.str ().length ()","0U",&local_4a0,&local_4c4);
  std::__cxx11::string::~string(local_4c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(&local_4d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  local_4e9 = pstore::command_line::opt<bool,_pstore::command_line::parser<bool,_void>_>::get
                        ((opt<bool,_pstore::command_line::parser<bool,_void>_> *)&gtest_ar.message_)
  ;
  local_4ea = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_4e8,"option.get ()","true",&local_4e9,&local_4ea);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  local_514 = pstore::command_line::option::get_num_occurrences((option *)&gtest_ar.message_);
  local_518 = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_510,"option.get_num_occurrences ()","1U",&local_514,&local_518);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_520);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              (&local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=(&local_528,&local_520);
    testing::internal::AssertHelper::~AssertHelper(&local_528);
    testing::Message::~Message(&local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  std::__cxx11::ostringstream::~ostringstream(local_3f0);
  std::__cxx11::ostringstream::~ostringstream(local_278);
  pstore::command_line::opt<bool,_pstore::command_line::parser<bool,_void>_>::~opt
            ((opt<bool,_pstore::command_line::parser<bool,_void>_> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_F (ClCommandLine, BooleanOption) {
    opt<bool> option ("arg");
    EXPECT_EQ (option.get (), false);

    this->add ("progname", "--arg");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_TRUE (res);

    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_EQ (option.get (), true);
    EXPECT_EQ (option.get_num_occurrences (), 1U);
}